

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<double,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  size_type *psVar2;
  FunctionData *pFVar3;
  Vector *pVVar4;
  uint64_t uVar5;
  reference pvVar6;
  ulong uVar7;
  unsigned_long *q;
  size_type *psVar8;
  idx_t iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  QuantileDirect<duckdb::hugeint_t> local_a9;
  list_entry_t *local_a8;
  AggregateFinalizeData *local_a0;
  long local_98;
  pointer local_90;
  FunctionData *local_88;
  Vector *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar4 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar5 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_88 = pFVar3 + 8;
    local_a0 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar3 + 0x10) - *(long *)(pFVar3 + 8)) / 0x68 + uVar5);
    local_90 = (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
               super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = uVar5 * 8 + *(long *)(pVVar4 + 0x20);
    target->offset = uVar5;
    psVar2 = *(size_type **)(pFVar3 + 0x28);
    uVar7 = 0;
    local_a8 = target;
    local_80 = pVVar4;
    for (psVar8 = *(size_type **)(pFVar3 + 0x20); psVar8 != psVar2; psVar8 = psVar8 + 1) {
      pvVar6 = vector<duckdb::QuantileValue,_true>::get<true>
                         ((vector<duckdb::QuantileValue,_true> *)local_88,*psVar8);
      iVar9 = (long)(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                    super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                    super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4;
      local_78.desc = *(bool *)(pFVar3 + 0x38);
      lVar1 = iVar9 - 1;
      auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar11._0_8_ = lVar1;
      auVar11._12_4_ = 0x45300000;
      dStack_40 = auVar11._8_8_ - 1.9342813113834067e+25;
      local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                    pvVar6->dbl;
      local_48 = local_78.RN;
      dVar10 = floor(local_78.RN);
      local_78.FRN = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
      dVar10 = ceil(local_48);
      local_78.CRN = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
      local_78.begin = uVar7;
      local_78.end = iVar9;
      dVar10 = Interpolator<false>::
               Operation<duckdb::hugeint_t,double,duckdb::QuantileDirect<duckdb::hugeint_t>>
                         (&local_78,local_90,local_80,&local_a9);
      *(double *)(local_98 + *psVar8 * 8) = dVar10;
      uVar7 = local_78.FRN;
    }
    uVar5 = (*(long *)(pFVar3 + 0x10) - *(long *)(pFVar3 + 8)) / 0x68;
    local_a8->length = uVar5;
    duckdb::ListVector::SetListSize(local_a0->result,uVar5 + local_a8->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}